

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O2

void build_impute_node<InputData<double,unsigned_long>&,WorkerMemory<ImputedData<unsigned_long,double>,double,double>&,double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<unsigned_long,_double>,_double,_double> *workspace,
               InputData<double,_unsigned_long> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  vector<double,_std::allocator<double>_> *this;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *this_00;
  vector<double,_std::allocator<double>_> *this_01;
  double dVar1;
  WeighImpRows WVar2;
  pointer puVar3;
  pointer pdVar4;
  unsigned_long uVar5;
  pointer pIVar6;
  double *pdVar7;
  pointer pdVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  pointer pdVar13;
  unsigned_long *key;
  unsigned_long *puVar14;
  uchar *puVar15;
  int *piVar16;
  size_t col_1;
  ImputeNode *pIVar17;
  double *pdVar18;
  ulong uVar19;
  unsigned_long uVar20;
  pointer pvVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  size_t col_5;
  vector<double,_std::allocator<double>_> *__range3;
  long lVar25;
  size_t sVar26;
  size_t col;
  ulong uVar27;
  size_t sVar28;
  long lVar29;
  double dVar30;
  double extraout_XMM0_Qb;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double dVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  double dVar40;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar41;
  size_t ix;
  vector<double,_std::allocator<double>_> *__range3_1;
  double __tmp;
  double dStack_70;
  pointer local_68;
  double local_60;
  size_t local_58;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_50;
  ModelParams *local_48;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_40;
  double local_38;
  
  bVar10 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar11 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_58 = curr_depth;
  local_50 = imputer_tree;
  local_48 = model_params;
  if (bVar10 && bVar11) {
    lVar25 = (workspace->end - workspace->st) + 1;
    auVar31._8_4_ = (int)((ulong)lVar25 >> 0x20);
    auVar31._0_8_ = lVar25;
    auVar31._12_4_ = 0x45300000;
    dStack_70 = auVar31._8_8_ - 1.9342813113834067e+25;
    __tmp = dStack_70 + ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
  }
  else {
    __tmp = calculate_sum_weights<double>
                      (&workspace->ix_arr,workspace->st,workspace->end,curr_depth,
                       &workspace->weights_arr,&workspace->weights_map);
    dStack_70 = extraout_XMM0_Qb;
  }
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (&imputer->num_sum,input_data->ncols_numeric,(value_type_conflict *)&ix);
  this = &imputer->num_weight;
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (this,input_data->ncols_numeric,(value_type_conflict *)&ix);
  this_00 = &imputer->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(this_00,input_data->ncols_categ);
  this_01 = &imputer->cat_weight;
  ix = 0;
  std::vector<double,_std::allocator<double>_>::resize
            (this_01,input_data->ncols_categ,(value_type_conflict *)&ix);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(&imputer->num_sum);
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(this);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::_M_shrink_to_fit(this_00);
  __range3_1 = this_01;
  std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit(this_01);
  lVar25 = 0;
  for (uVar27 = 0; uVar19 = input_data->ncols_categ, uVar27 < uVar19; uVar27 = uVar27 + 1) {
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this_00->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar25),(long)input_data->ncat[uVar27]);
    std::vector<double,_std::allocator<double>_>::_M_shrink_to_fit
              ((vector<double,_std::allocator<double>_> *)
               ((long)&(((this_00->
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data + lVar25));
    lVar25 = lVar25 + 0x18;
  }
  uVar27 = input_data->ncols_numeric;
  if ((uVar19 != 0) || (input_data->Xc_indptr == (unsigned_long *)0x0 && uVar27 != 0)) {
    pdVar18 = input_data->numeric_data;
    if (bVar10 && bVar11) {
      if (pdVar18 != (double *)0x0) {
        sVar26 = workspace->st;
        uVar23 = workspace->end;
        pdVar13 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar24 = 0; uVar24 != uVar27; uVar24 = uVar24 + 1) {
          puVar3 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar22 = input_data->nrows;
          pdVar4 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar25 = 0;
          for (sVar28 = sVar26; sVar28 <= uVar23; sVar28 = sVar28 + 1) {
            if ((ulong)ABS(pdVar18[sVar22 * uVar24 + puVar3[sVar28]]) < 0x7ff0000000000000) {
              lVar25 = lVar25 + 1;
              dVar30 = pdVar4[uVar24];
              auVar39._8_4_ = (int)((ulong)lVar25 >> 0x20);
              auVar39._0_8_ = lVar25;
              auVar39._12_4_ = 0x45300000;
              pdVar4[uVar24] =
                   (pdVar18[sVar22 * uVar24 + puVar3[sVar28]] - dVar30) /
                   ((auVar39._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0)) + dVar30;
            }
          }
          auVar34._8_4_ = (int)((ulong)lVar25 >> 0x20);
          auVar34._0_8_ = lVar25;
          auVar34._12_4_ = 0x45300000;
          pdVar13[uVar24] =
               (auVar34._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
        }
      }
      piVar16 = input_data->categ_data;
      if (piVar16 != (int *)0x0) {
        sVar26 = workspace->st;
        uVar27 = workspace->end;
        pdVar13 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        for (uVar23 = 0; uVar23 != uVar19; uVar23 = uVar23 + 1) {
          puVar3 = (workspace->ix_arr).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          sVar22 = input_data->nrows;
          pvVar21 = (this_00->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar25 = 0;
          for (sVar28 = sVar26; sVar28 <= uVar27; sVar28 = sVar28 + 1) {
            lVar29 = (long)piVar16[sVar22 * uVar23 + puVar3[sVar28]];
            if (-1 < lVar29) {
              lVar25 = lVar25 + 1;
              lVar9 = *(long *)&pvVar21[uVar23].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data;
              *(double *)(lVar9 + lVar29 * 8) = *(double *)(lVar9 + lVar29 * 8) + 1.0;
            }
          }
          auVar37._8_4_ = (int)((ulong)lVar25 >> 0x20);
          auVar37._0_8_ = lVar25;
          auVar37._12_4_ = 0x45300000;
          pdVar13[uVar23] =
               (auVar37._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
        }
      }
    }
    else {
      if (pdVar18 != (double *)0x0) {
        for (uVar19 = 0; uVar19 < uVar27; uVar19 = uVar19 + 1) {
          sVar26 = workspace->st;
          lVar25 = sVar26 * 8;
          dVar30 = 0.0;
          dVar35 = 0.0;
          for (; sVar26 <= workspace->end; sVar26 = sVar26 + 1) {
            puVar3 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar29 = *(long *)((long)puVar3 + lVar25);
            dVar40 = input_data->numeric_data[lVar29 + input_data->nrows * uVar19];
            if ((ulong)ABS(dVar40) < 0x7ff0000000000000) {
              pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish == pdVar13) {
                local_60 = dVar30;
                pVar41 = tsl::detail_robin_hash::
                         robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                         ::try_emplace<unsigned_long_const&>
                                   ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                     *)&workspace->weights_map,
                                    (unsigned_long *)((long)puVar3 + lVar25));
                puVar15 = (pVar41.first.m_bucket.m_bucket)->m_value + 8;
                dVar30 = local_60;
              }
              else {
                puVar15 = (uchar *)(pdVar13 + lVar29);
              }
              dVar1 = *(double *)puVar15;
              pdVar13 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start;
              pdVar13[uVar19] = dVar1 + pdVar13[uVar19];
              dVar30 = dVar40 * dVar1 - dVar30;
              dVar40 = dVar35 + dVar30;
              dVar30 = (dVar40 - dVar35) - dVar30;
              dVar35 = dVar40;
            }
            lVar25 = lVar25 + 8;
          }
          (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar19] =
               dVar35 / (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar19];
          uVar27 = input_data->ncols_numeric;
        }
        uVar19 = input_data->ncols_categ;
      }
      if (uVar19 != 0) {
        for (uVar27 = workspace->st; uVar27 <= workspace->end; uVar27 = uVar27 + 1) {
          ix = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar27];
          pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar13) {
            pVar41 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::try_emplace<unsigned_long_const&>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&ix);
            puVar15 = (pVar41.first.m_bucket.m_bucket)->m_value + 8;
            uVar19 = input_data->ncols_categ;
          }
          else {
            puVar15 = (uchar *)(pdVar13 + ix);
          }
          dVar30 = *(double *)puVar15;
          sVar26 = input_data->nrows;
          piVar16 = input_data->categ_data + ix;
          pvVar21 = (this_00->
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pdVar13 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          for (uVar23 = 0; uVar19 != uVar23; uVar23 = uVar23 + 1) {
            lVar25 = (long)*piVar16;
            if (-1 < lVar25) {
              lVar29 = *(long *)&(pvVar21->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data;
              *(double *)(lVar29 + lVar25 * 8) = *(double *)(lVar29 + lVar25 * 8) + dVar30;
              pdVar13[uVar23] = pdVar13[uVar23] + dVar30;
            }
            pvVar21 = pvVar21 + 1;
            piVar16 = piVar16 + sVar26;
          }
        }
      }
    }
  }
  if (input_data->Xc_indptr == (unsigned_long *)0x0) {
LAB_00205f62:
    auVar32._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
    auVar32._8_4_ = (int)(min_imp_obs >> 0x20);
    auVar32._12_4_ = 0x45300000;
    dVar30 = (auVar32._8_8_ - 1.9342813113834067e+25) + (auVar32._0_8_ - 4503599627370496.0);
    pdVar13 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish != pdVar13) {
      sVar26 = input_data->ncols_numeric;
      pdVar4 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar6 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar22 = 0; sVar22 != sVar26; sVar22 = sVar22 + 1) {
        pdVar18 = pdVar4 + sVar22;
        lVar25 = 2;
        pIVar17 = imputer;
        if (*pdVar18 <= dVar30 && dVar30 != *pdVar18) {
          while( true ) {
            sVar28 = pIVar17->parent;
            pIVar17 = pIVar6 + sVar28;
            dVar35 = *(double *)
                      (*(long *)&pIVar6[sVar28].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar22 * 8);
            if ((ulong)ABS(dVar35) < 0x7ff0000000000000) break;
            if (sVar28 == 0) {
              pdVar13[sVar22] = NAN;
              dVar35 = 0.0;
              goto LAB_0020605d;
            }
            lVar25 = lVar25 + 2;
          }
          pdVar13[sVar22] =
               dVar35 / (pIVar17->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                        _M_impl.super__Vector_impl_data._M_start[sVar22];
          auVar36._8_4_ = (int)((ulong)lVar25 >> 0x20);
          auVar36._0_8_ = lVar25;
          auVar36._12_4_ = 0x45300000;
          dVar35 = __tmp / ((auVar36._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0));
LAB_0020605d:
          pdVar4[sVar22] = dVar35;
        }
      }
    }
    pvVar21 = (imputer->cat_sum).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((imputer->cat_sum).
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar21) {
      piVar16 = input_data->ncat;
      sVar26 = input_data->ncols_categ;
      pdVar4 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar6 = (local_50->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar22 = 0; sVar22 != sVar26; sVar22 = sVar22 + 1) {
        pIVar17 = imputer;
        lVar25 = 2;
        if (dVar30 <= pdVar4[sVar22]) {
          pdVar7 = pvVar21[sVar22].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          for (pdVar18 = pvVar21[sVar22].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start; pdVar18 != pdVar7; pdVar18 = pdVar18 + 1
              ) {
            *pdVar18 = *pdVar18 / pdVar4[sVar22];
          }
        }
        else {
          while( true ) {
            sVar28 = pIVar17->parent;
            pIVar17 = pIVar6 + sVar28;
            lVar29 = *(long *)&pIVar6[sVar28].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            if (0.0 < *(double *)(lVar29 + sVar22 * 8)) break;
            if (sVar28 == 0) goto LAB_002061a4;
            lVar25 = lVar25 + 2;
          }
          auVar38._8_4_ = (int)((ulong)lVar25 >> 0x20);
          auVar38._0_8_ = lVar25;
          auVar38._12_4_ = 0x45300000;
          uVar12 = piVar16[sVar22];
          if (piVar16[sVar22] < 1) {
            uVar12 = 0;
          }
          for (uVar27 = 0; uVar12 != uVar27; uVar27 = uVar27 + 1) {
            dVar35 = *(double *)
                      (*(long *)&(pIVar17->cat_sum).
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[sVar22].
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data + uVar27 * 8);
            dVar40 = 0.0;
            if (0.0 < dVar35) {
              dVar40 = dVar35 / *(double *)(lVar29 + sVar22 * 8);
            }
            pdVar8 = pvVar21[sVar22].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar8[uVar27] = dVar40 + pdVar8[uVar27];
            pdVar4[sVar22] =
                 __tmp / ((auVar38._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0));
          }
LAB_002061a4:
          dVar35 = 0.0;
          for (pdVar18 = pvVar21[sVar22].super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start;
              pdVar18 !=
              pvVar21[sVar22].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish; pdVar18 = pdVar18 + 1) {
            dVar35 = dVar35 + *pdVar18;
          }
          pdVar4[sVar22] = dVar35;
        }
      }
    }
    WVar2 = local_48->weigh_imp_rows;
    if (WVar2 == Flat) {
      pdVar7 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar18 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar18 != pdVar7;
          pdVar18 = pdVar18 + 1) {
        *pdVar18 = *pdVar18 / __tmp;
      }
      pdVar7 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar18 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar18 != pdVar7;
          pdVar18 = pdVar18 + 1) {
        *pdVar18 = *pdVar18 / __tmp;
      }
    }
    else if (WVar2 == Inverse) {
      pdVar7 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar18 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar18 != pdVar7;
          pdVar18 = pdVar18 + 1) {
        *pdVar18 = *pdVar18 / (SQRT(__tmp) * __tmp);
      }
      pdVar7 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar18 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar18 != pdVar7;
          pdVar18 = pdVar18 + 1) {
        *pdVar18 = *pdVar18 / (SQRT(__tmp) * __tmp);
      }
    }
    lVar25 = local_58 + 1;
    auVar33._8_4_ = (int)((ulong)lVar25 >> 0x20);
    auVar33._0_8_ = lVar25;
    auVar33._12_4_ = 0x45300000;
    dVar30 = (auVar33._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar25) - 4503599627370496.0);
    if (local_48->depth_imp == Higher) {
      pdVar7 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar18 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar18 != pdVar7;
          pdVar18 = pdVar18 + 1) {
        *pdVar18 = *pdVar18 * dVar30;
      }
      pdVar7 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar18 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar18 != pdVar7;
          pdVar18 = pdVar18 + 1) {
        *pdVar18 = *pdVar18 * dVar30;
      }
    }
    else if (local_48->depth_imp == Lower) {
      pdVar7 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar18 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar18 != pdVar7;
          pdVar18 = pdVar18 + 1) {
        *pdVar18 = *pdVar18 / dVar30;
      }
      pdVar7 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pdVar18 = (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_start; pdVar18 != pdVar7;
          pdVar18 = pdVar18 + 1) {
        *pdVar18 = *pdVar18 / dVar30;
      }
    }
    if ((WVar2 != Prop) || (local_48->depth_imp != Same)) {
      sVar26 = input_data->ncols_numeric;
      pdVar4 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (sVar22 = 0; sVar26 != sVar22; sVar22 = sVar22 + 1) {
        pdVar13[sVar22] = pdVar4[sVar22] * pdVar13[sVar22];
      }
      piVar16 = input_data->ncat;
      sVar26 = input_data->ncols_categ;
      for (sVar22 = 0; sVar22 != sVar26; sVar22 = sVar22 + 1) {
        pdVar13 = (__range3_1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar12 = piVar16[sVar22];
        if (piVar16[sVar22] < 1) {
          uVar12 = 0;
        }
        for (uVar27 = 0; uVar12 != uVar27; uVar27 = uVar27 + 1) {
          pdVar4 = pvVar21[sVar22].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar4[uVar27] = pdVar13[sVar22] * pdVar4[uVar27];
        }
      }
    }
    return;
  }
  puVar3 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pdVar4 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar13 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start; pdVar13 != pdVar4; pdVar13 = pdVar13 + 1) {
    *pdVar13 = __tmp;
  }
  local_40 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
              *)&workspace->weights_map;
  dVar30 = (double)0;
  local_68 = puVar3;
LAB_00205d6b:
  if ((ulong)dVar30 < input_data->ncols_numeric) {
    uVar20 = input_data->Xc_indptr[(long)dVar30];
    uVar5 = input_data->Xc_indptr[(long)dVar30 + 1];
    local_60 = (double)((long)dVar30 + 1);
    uVar27 = input_data->Xc_ind[uVar5 - 1];
    key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                    (local_68 + workspace->st,puVar3 + workspace->end + 1,
                     input_data->Xc_ind + uVar20);
LAB_00205dc3:
    do {
      if (((key == puVar3 + workspace->end + 1) || (uVar20 == uVar5)) ||
         (uVar19 = *key, uVar27 < uVar19)) goto LAB_00205f33;
      puVar14 = input_data->Xc_ind;
      if (puVar14[uVar20] == uVar19) {
        dVar35 = input_data->Xc[uVar20];
        pdVar13 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish == pdVar13) {
          dVar40 = 1.0;
          if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
            local_38 = dVar35;
            pVar41 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::try_emplace<unsigned_long_const&>(local_40,key);
            puVar15 = (pVar41.first.m_bucket.m_bucket)->m_value + 8;
            dVar35 = local_38;
            goto LAB_00205e9e;
          }
        }
        else {
          puVar15 = (uchar *)(pdVar13 + uVar19);
LAB_00205e9e:
          dVar40 = *(double *)puVar15;
        }
        if ((ulong)ABS(dVar35) < 0x7ff0000000000000) {
          pdVar13 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar13[(long)dVar30] = dVar40 * dVar35 + pdVar13[(long)dVar30];
        }
        else {
          pdVar13 = (this->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar13[(long)dVar30] = pdVar13[(long)dVar30] - dVar40;
        }
        if ((key == local_68 + workspace->end) || (uVar20 == uVar5 - 1)) goto LAB_00205f33;
        key = key + 1;
        puVar14 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (input_data->Xc_ind + uVar20,input_data->Xc_ind + uVar5,key);
      }
      else {
        if (uVar19 < puVar14[uVar20]) {
          key = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>();
          goto LAB_00205dc3;
        }
        puVar14 = std::__lower_bound<unsigned_long*,unsigned_long,__gnu_cxx::__ops::_Iter_less_val>
                            (puVar14 + uVar20 + 1,puVar14 + uVar5,key);
      }
      uVar20 = (long)puVar14 - (long)input_data->Xc_ind >> 3;
    } while( true );
  }
  goto LAB_00205f62;
LAB_00205f33:
  pdVar13 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  pdVar13[(long)dVar30] =
       pdVar13[(long)dVar30] /
       (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start[(long)dVar30];
  dVar30 = local_60;
  goto LAB_00205d6b;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}